

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O2

Reporters * ApprovalTests::ReporterFactory::createMap_abi_cxx11_(void)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  *in_RDI;
  allocator local_59;
  key_type local_58;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  ::std::__cxx11::string::string((string *)&local_58,"AutoApproveIfMissingReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:52:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:52:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"AutoApproveReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:53:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:53:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"CIBuildOnlyReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:54:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:54:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"ClipboardReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:55:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:55:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"DefaultFrontLoadedReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:56:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:56:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"DefaultReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:57:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:57:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"DiffReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:58:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:58:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"EnvironmentVariableReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:59:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:59:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"QuietReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:60:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:60:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"TextDiffReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:61:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:61:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Linux::BeyondCompareReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:63:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:63:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Linux::MeldReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:64:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:64:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Linux::SublimeMergeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:65:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:65:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Linux::KDiff3Reporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:66:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:66:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::AraxisMergeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:69:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:69:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::BeyondCompareReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:70:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:70:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::DiffMergeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:71:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:71:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::KaleidoscopeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:72:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:72:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::P4MergeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:73:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:73:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::SublimeMergeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:74:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:74:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::KDiff3Reporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:75:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:75:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::TkDiffReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:76:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:76:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::VisualStudioCodeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:77:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:77:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Mac::CLionDiffReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:78:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:78:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Windows::TortoiseDiffReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:81:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:81:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Windows::TortoiseGitDiffReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:82:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:82:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Windows::BeyondCompareReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:83:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:83:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Windows::WinMergeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:84:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:84:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Windows::AraxisMergeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:85:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:85:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Windows::CodeCompareReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:86:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:86:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Windows::SublimeMergeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:87:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:87:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Windows::KDiff3Reporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:88:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:88:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"Windows::VisualStudioCodeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:89:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:89:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string
            ((string *)&local_58,"CrossPlatform::VisualStudioCodeReporter",&local_59);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
           ::operator[](in_RDI,&local_58);
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar2->super__Function_base)._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pmVar2->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pmVar2->super__Function_base)._M_functor + 8) = 0;
  local_28 = (pmVar2->super__Function_base)._M_manager;
  (pmVar2->super__Function_base)._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:91:9)>
       ::_M_manager;
  local_20 = pmVar2->_M_invoker;
  pmVar2->_M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/reporters/ReporterFactory.cpp:91:9)>
       ::_M_invoke;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  return in_RDI;
}

Assistant:

ReporterFactory::Reporters ReporterFactory::createMap()
    {
        Reporters map;

        APPROVAL_TESTS_REGISTER_REPORTER(AutoApproveIfMissingReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(AutoApproveReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(CIBuildOnlyReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(ClipboardReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(DefaultFrontLoadedReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(DefaultReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(DiffReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(EnvironmentVariableReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(QuietReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(TextDiffReporter);

        APPROVAL_TESTS_REGISTER_REPORTER(Linux::BeyondCompareReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Linux::MeldReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Linux::SublimeMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Linux::KDiff3Reporter);

        // begin-snippet: register_reporter_with_factory
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::AraxisMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::BeyondCompareReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::DiffMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::KaleidoscopeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::P4MergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::SublimeMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::KDiff3Reporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::TkDiffReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::VisualStudioCodeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::CLionDiffReporter);
        // end-snippet

        APPROVAL_TESTS_REGISTER_REPORTER(Windows::TortoiseDiffReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::TortoiseGitDiffReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::BeyondCompareReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::WinMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::AraxisMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::CodeCompareReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::SublimeMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::KDiff3Reporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::VisualStudioCodeReporter);

        APPROVAL_TESTS_REGISTER_REPORTER(CrossPlatform::VisualStudioCodeReporter);

        return map;
    }